

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  undefined8 uVar1;
  long *plVar2;
  bool bVar3;
  TransformPromiseNodeBase *this_00;
  Promise<void> promise;
  WaitScope waitScope;
  PromiseFulfillerPair<void> paf;
  Fault f;
  TaskSet tasks;
  ErrorHandlerImpl errorHandler;
  EventLoop loop;
  undefined1 local_238 [40];
  long *local_210;
  undefined8 *local_208;
  long *local_200;
  Fault local_1f8;
  TaskSet local_1f0;
  ErrorHandler local_1c8;
  undefined4 local_1c0;
  ExceptionOrValue local_1b8;
  char local_58;
  
  EventLoop::EventLoop((EventLoop *)&stack0xffffffffffffffb8);
  local_238._24_4_ = 0xffffffff;
  local_238._16_8_ = (Task *)&stack0xffffffffffffffb8;
  EventLoop::enterScope((EventLoop *)&stack0xffffffffffffffb8);
  local_1c8._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_00435df0;
  local_1c0 = 0;
  TaskSet::TaskSet(&local_1f0,&local_1c8);
  if ((local_1f0.tasks.ptr.ptr != (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x28c,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
               (char (*) [33])"failed: expected tasks.isEmpty()");
  }
  newPromiseAndFulfiller<void>();
  TaskSet::add(&local_1f0,(Promise<void> *)(local_238 + 0x20));
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_1b8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:656:23),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar1 = local_1b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004360c0;
  local_238._0_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_238._8_8_ = this_00;
  if ((PromiseNode *)local_1b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_1b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_1b8.exception.ptr._0_8_)
              (local_1b8.exception.ptr._0_8_,(char *)(uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  TaskSet::add(&local_1f0,(Promise<void> *)local_238);
  uVar1 = local_238._8_8_;
  if ((TransformPromiseNodeBase *)local_238._8_8_ != (TransformPromiseNodeBase *)0x0) {
    local_238._8_8_ = (TransformPromiseNodeBase *)0x0;
    (***(_func_int ***)local_238._0_8_)
              (local_238._0_8_,
               ((PromiseNode *)uVar1)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)uVar1)->_vptr_PromiseNode);
  }
  if ((local_1f0.tasks.ptr.ptr == (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x292,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
               (char (*) [34])"failed: expected !tasks.isEmpty()");
  }
  TaskSet::onEmpty((TaskSet *)local_238);
  bVar3 = _::pollImpl((PromiseNode *)local_238._8_8_,(WaitScope *)(local_238 + 0x10));
  if (bVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x295,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\"",
               (char (*) [42])"failed: expected !promise.poll(waitScope)");
  }
  if ((local_1f0.tasks.ptr.ptr == (Task *)0x0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x296,ERROR,"\"failed: expected \" \"!tasks.isEmpty()\"",
               (char (*) [34])"failed: expected !tasks.isEmpty()");
  }
  (**(code **)*local_200)(local_200,&local_1b8);
  bVar3 = _::pollImpl((PromiseNode *)local_238._8_8_,(WaitScope *)(local_238 + 0x10));
  if (bVar3) {
    if ((local_1f0.tasks.ptr.ptr != (Task *)0x0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x29a,ERROR,"\"failed: expected \" \"tasks.isEmpty()\"",
                 (char (*) [33])"failed: expected tasks.isEmpty()");
    }
    local_1b8.exception.ptr._0_8_ = local_1b8.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_58 = '\0';
    _::waitImpl((Own<kj::_::PromiseNode> *)local_238,&local_1b8,(WaitScope *)(local_238 + 0x10));
    if (local_58 == '\x01') {
      if (local_1b8.exception.ptr.isSet != false) {
        throwRecoverableException(&local_1b8.exception.ptr.field_1.value,0);
      }
    }
    else {
      if (local_1b8.exception.ptr.isSet == false) {
        _::unreachable();
      }
      throwRecoverableException(&local_1b8.exception.ptr.field_1.value,0);
    }
    if (local_1b8.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b8.exception.ptr.field_1.value);
    }
    uVar1 = local_238._8_8_;
    if ((TransformPromiseNodeBase *)local_238._8_8_ != (TransformPromiseNodeBase *)0x0) {
      local_238._8_8_ = (TransformPromiseNodeBase *)0x0;
      (***(_func_int ***)local_238._0_8_)
                (local_238._0_8_,
                 ((PromiseNode *)uVar1)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)uVar1)->_vptr_PromiseNode);
    }
    plVar2 = local_200;
    if (local_200 != (long *)0x0) {
      local_200 = (long *)0x0;
      (**(code **)*local_208)(local_208,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_210;
    if (local_210 != (long *)0x0) {
      local_210 = (long *)0x0;
      (***(_func_int ***)local_238._32_8_)
                (local_238._32_8_,*(long *)(*plVar2 + -0x10) + (long)plVar2);
    }
    TaskSet::~TaskSet(&local_1f0);
    EventLoop::leaveScope((EventLoop *)local_238._16_8_);
    EventLoop::~EventLoop((EventLoop *)&stack0xffffffffffffffb8);
    return;
  }
  local_1f8.exception = (Exception *)0x0;
  local_1b8.exception.ptr._0_8_ = (Disposer *)0x0;
  local_1b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  _::Debug::Fault::init
            (&local_1f8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
            );
  _::Debug::Fault::fatal(&local_1f8);
}

Assistant:

TEST(Async, TaskSetOnEmpty) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  KJ_EXPECT(tasks.isEmpty());

  auto paf = newPromiseAndFulfiller<void>();
  tasks.add(kj::mv(paf.promise));
  tasks.add(evalLater([]() {}));

  KJ_EXPECT(!tasks.isEmpty());

  auto promise = tasks.onEmpty();
  KJ_EXPECT(!promise.poll(waitScope));
  KJ_EXPECT(!tasks.isEmpty());

  paf.fulfiller->fulfill();
  KJ_ASSERT(promise.poll(waitScope));
  KJ_EXPECT(tasks.isEmpty());
  promise.wait(waitScope);
}